

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O3

EAMType __thiscall OpenMD::EAMAdapter::getEAMType(EAMAdapter *this)

{
  EAMParameters eamParam;
  EAMParameters local_40;
  
  getEAMParam(&local_40,this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.latticeType._M_dataplus._M_p != &local_40.latticeType.field_2) {
    operator_delete(local_40.latticeType._M_dataplus._M_p,
                    local_40.latticeType.field_2._M_allocated_capacity + 1);
  }
  return local_40.eamType;
}

Assistant:

EAMType EAMAdapter::getEAMType() {
    EAMParameters eamParam = getEAMParam();
    return eamParam.eamType;
  }